

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  char_t cVar1;
  byte local_2e;
  byte local_2d;
  uint32_t local_2c;
  char_t ch_1;
  char_t ch;
  byte *pbStack_28;
  uint ucsc;
  char_t *stre;
  gap *g_local;
  char_t *s_local;
  
  pbStack_28 = s + 1;
  cVar1 = *pbStack_28;
  if (cVar1 != '#') {
    if (cVar1 == 'a') {
      pbStack_28 = s + 2;
      if (*pbStack_28 == 'm') {
        pbStack_28 = s + 3;
        if ((s[3] == 'p') && (pbStack_28 = s + 4, s[4] == ';')) {
          g_local = (gap *)(s + 1);
          *s = '&';
          gap::push(g,(char_t **)&g_local,(long)(s + 5) - (long)g_local);
          return s + 5;
        }
      }
      else if ((((*pbStack_28 == 'p') && (pbStack_28 = s + 3, s[3] == 'o')) &&
               (pbStack_28 = s + 4, s[4] == 's')) && (pbStack_28 = s + 5, s[5] == ';')) {
        g_local = (gap *)(s + 1);
        *s = '\'';
        gap::push(g,(char_t **)&g_local,(long)(s + 6) - (long)g_local);
        return s + 6;
      }
    }
    else if (cVar1 == 'g') {
      pbStack_28 = s + 2;
      if ((s[2] == 't') && (pbStack_28 = s + 3, s[3] == ';')) {
        g_local = (gap *)(s + 1);
        *s = '>';
        gap::push(g,(char_t **)&g_local,(long)(s + 4) - (long)g_local);
        return s + 4;
      }
    }
    else if (cVar1 == 'l') {
      pbStack_28 = s + 2;
      if ((s[2] == 't') && (pbStack_28 = s + 3, s[3] == ';')) {
        g_local = (gap *)(s + 1);
        *s = '<';
        gap::push(g,(char_t **)&g_local,(long)(s + 4) - (long)g_local);
        return s + 4;
      }
    }
    else if ((((cVar1 == 'q') && (pbStack_28 = s + 2, s[2] == 'u')) &&
             (pbStack_28 = s + 3, s[3] == 'o')) &&
            ((pbStack_28 = s + 4, s[4] == 't' && (pbStack_28 = s + 5, s[5] == ';')))) {
      g_local = (gap *)(s + 1);
      *s = '\"';
      gap::push(g,(char_t **)&g_local,(long)(s + 6) - (long)g_local);
      return s + 6;
    }
    return pbStack_28;
  }
  local_2c = 0;
  if (s[2] == 'x') {
    pbStack_28 = s + 3;
    local_2d = *pbStack_28;
    if (local_2d == 0x3b) {
      return pbStack_28;
    }
    do {
      if (local_2d - 0x30 < 10) {
        local_2c = local_2c * 0x10 + (local_2d - 0x30);
      }
      else {
        if (5 < (local_2d | 0x20) - 0x61) goto LAB_00118325;
        local_2c = local_2c * 0x10 + ((local_2d | 0x20) - 0x57);
      }
      local_2d = pbStack_28[1];
      pbStack_28 = pbStack_28 + 1;
    } while( true );
  }
  pbStack_28 = s + 2;
  local_2e = s[2];
  if (local_2e == 0x3b) {
    return pbStack_28;
  }
  while (local_2e - 0x30 < 10) {
    local_2c = local_2c * 10 + (local_2e - 0x30);
    local_2e = pbStack_28[1];
    pbStack_28 = pbStack_28 + 1;
  }
  if (local_2e != 0x3b) {
    return pbStack_28;
  }
LAB_001183ed:
  pbStack_28 = pbStack_28 + 1;
  g_local = (gap *)s;
  g_local = (gap *)utf8_writer::any(s,local_2c);
  gap::push(g,(char_t **)&g_local,(long)pbStack_28 - (long)g_local);
  return pbStack_28;
LAB_00118325:
  if (local_2d != 0x3b) {
    return pbStack_28;
  }
  goto LAB_001183ed;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}